

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_scaleStats(uint *table,U32 lastEltIndex,U32 logTarget)

{
  uint uVar1;
  U32 factor;
  U32 prevsum;
  U32 logTarget_local;
  U32 lastEltIndex_local;
  uint *table_local;
  
  table_local._4_4_ = sum_u32(table,(ulong)(lastEltIndex + 1));
  uVar1 = table_local._4_4_ >> ((byte)logTarget & 0x1f);
  if (0x1d < logTarget) {
    __assert_fail("logTarget < 30",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_opt.c"
                  ,0x7d,"U32 ZSTD_scaleStats(unsigned int *, U32, U32)");
  }
  if (1 < uVar1) {
    uVar1 = ZSTD_highbit32(uVar1);
    table_local._4_4_ = ZSTD_downscaleStats(table,lastEltIndex,uVar1,base_1guaranteed);
  }
  return table_local._4_4_;
}

Assistant:

static U32 ZSTD_scaleStats(unsigned* table, U32 lastEltIndex, U32 logTarget)
{
    U32 const prevsum = sum_u32(table, lastEltIndex+1);
    U32 const factor = prevsum >> logTarget;
    DEBUGLOG(5, "ZSTD_scaleStats (nbElts=%u, target=%u)", (unsigned)lastEltIndex+1, (unsigned)logTarget);
    assert(logTarget < 30);
    if (factor <= 1) return prevsum;
    return ZSTD_downscaleStats(table, lastEltIndex, ZSTD_highbit32(factor), base_1guaranteed);
}